

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flux_test.cpp
# Opt level: O2

void flux_test::clearSource(void)

{
  SystemImpl *this;
  FlowExp *this_00;
  long lVar1;
  
  this = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this);
  this_00 = (FlowExp *)operator_new(0x38);
  FlowExp::FlowExp(this_00);
  (**(code **)(*(long *)this_00 + 0x30))(this_00,this);
  (**(code **)(*(long *)this_00 + 0x28))(this_00);
  lVar1 = (**(code **)(*(long *)this_00 + 0x18))(this_00);
  if (lVar1 == 0) {
    return;
  }
  __assert_fail("flux->getSource() == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/unit_tests/flux_test.cpp"
                ,0x2b,"static void flux_test::clearSource()");
}

Assistant:

void flux_test::clearSource() {
    auto *s1 = new SystemImpl();
    auto *flux = new FlowExp();
    flux->setSource(s1);
    flux->clearSource();
    assert(flux->getSource() == nullptr);
}